

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O3

void __thiscall MP1Node::updateMembershipList(MP1Node *this,int id,short port,long heartbeat)

{
  pointer pMVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  Address logAddr;
  MemberListEntry entry;
  Address local_50;
  MemberListEntry local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"updating membership list ...",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  pMVar1 = (this->memberNode->memberList).
           super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (int)((long)(this->memberNode->memberList).
                      super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pMVar1 >> 3) * -0x55555555;
  if (0 < (int)uVar2) {
    lVar5 = 0;
    do {
      if ((*(int *)((long)&pMVar1->id + lVar5) == id) &&
         (*(short *)((long)&pMVar1->port + lVar5) == port)) {
        lVar4 = MemberListEntry::getheartbeat((MemberListEntry *)((long)&pMVar1->id + lVar5));
        if (heartbeat <= lVar4) {
          return;
        }
        pMVar1 = (this->memberNode->memberList).
                 super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(long *)((long)&pMVar1->heartbeat + lVar5) = heartbeat;
        iVar3 = Params::getcurrtime(this->par);
        MemberListEntry::settimestamp((MemberListEntry *)((long)&pMVar1->id + lVar5),(long)iVar3);
        return;
      }
      lVar5 = lVar5 + 0x18;
    } while ((ulong)(uVar2 & 0x7fffffff) * 0x18 != lVar5);
  }
  iVar3 = Params::getcurrtime(this->par);
  MemberListEntry::MemberListEntry(&local_48,id,port,heartbeat,(long)iVar3);
  std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::push_back
            (&this->memberNode->memberList,&local_48);
  local_50.addr[0] = (undefined1)local_48.id;
  local_50.addr[1] = local_48.id._1_1_;
  local_50.addr[2] = local_48.id._2_1_;
  local_50.addr[3] = local_48.id._3_1_;
  local_50.addr[4] = (undefined1)local_48.port;
  local_50.addr[5] = local_48.port._1_1_;
  Log::logNodeAdd(this->log,&this->memberNode->addr,&local_50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"...end updateMembershipList.",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return;
}

Assistant:

void MP1Node::updateMembershipList(int id, short port, long heartbeat) {
    cout << "updating membership list ..." << endl;

    int sizeOfMemberList = this->memberNode->memberList.size();
    for (int i = 0; i < sizeOfMemberList; i++) {
        if (memberNode->memberList[i].id == id && memberNode->memberList[i].port == port) {
            if (heartbeat > memberNode->memberList[i].getheartbeat()) {
                memberNode->memberList[i].heartbeat = heartbeat;
                memberNode->memberList[i].settimestamp(par->getcurrtime());
            }
            return;
        }
    }

    //if the memberlist does not contain the entry, create a new one and push it into the list
    MemberListEntry entry(id, port, heartbeat, par->getcurrtime());
    memberNode->memberList.push_back(entry);

#ifdef DEBUGLOG
    Address logAddr;
    memcpy(&logAddr.addr[0], &entry.id, sizeof(int));
    memcpy(&logAddr.addr[4], &entry.port, sizeof(short));
    log->logNodeAdd(&memberNode->addr, &logAddr);
#endif

    cout << "...end updateMembershipList." << endl;
}